

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O1

void __thiscall
TApp_RequiredOptsDoubleNeg_Test::~TApp_RequiredOptsDoubleNeg_Test
          (TApp_RequiredOptsDoubleNeg_Test *this)

{
  (this->super_TApp).super_Test._vptr_Test = (_func_int **)&PTR__TApp_001a09d8;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->super_TApp).args);
  CLI::App::~App(&(this->super_TApp).app);
  testing::Test::~Test((Test *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(TApp, RequiredOptsDoubleNeg) {
    std::vector<std::string> strs;
    app.add_option("-s", strs)->required()->expected(-2);

    args = {"-s", "one"};

    EXPECT_THROW(run(), CLI::ArgumentMismatch);

    app.reset();

    args = {"-s", "one", "two", "-s", "three"};

    EXPECT_NO_THROW(run());

    EXPECT_EQ(strs, std::vector<std::string>({"one", "two", "three"}));

    app.reset();
    args = {"-s", "one", "two"};

    EXPECT_NO_THROW(run());

    EXPECT_EQ(strs, std::vector<std::string>({"one", "two"}));
}